

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sec.c
# Opt level: O3

edata_t * sec_alloc(tsdn_t *tsdn,pai_t *self,size_t size,size_t alignment,_Bool zero,_Bool guarded,
                   _Bool frequent_reuse,_Bool *deferred_work_generated)

{
  uint64_t *puVar1;
  witness_t **ppwVar2;
  anon_struct_8_1_803fbc3e_for_head aVar3;
  edata_t *peVar4;
  ulong uVar5;
  sec_shard_t *shard;
  byte bVar6;
  uint uVar7;
  sec_bin_t *psVar8;
  edata_list_active_t *peVar9;
  edata_list_active_t eVar10;
  int iVar11;
  mutex_prof_data_t *data;
  long lVar12;
  _func__Bool_tsdn_t_ptr_pai_t_ptr_edata_t_ptr_size_t_size_t__Bool_ptr *p_Var13;
  undefined1 local_49;
  pthread_mutex_t *local_48;
  edata_list_active_t result;
  
  if (((0x1000 < alignment || zero) ||
      (self[1].alloc_batch ==
       (_func_size_t_tsdn_t_ptr_pai_t_ptr_size_t_size_t_edata_list_active_t_ptr__Bool__Bool_ptr *)
       0x0)) || (self[1].expand < size)) {
    peVar4 = (edata_t *)
             (**(code **)self[1].alloc)
                       (tsdn,self[1].alloc,size,alignment,zero,0,frequent_reuse,
                        deferred_work_generated);
    return peVar4;
  }
  if (size < 0x7000000000000001) {
    uVar5 = size - 1;
    if (uVar5 == 0) {
      uVar7 = 0x40;
    }
    else {
      lVar12 = 0x3f;
      if (uVar5 != 0) {
        for (; uVar5 >> lVar12 == 0; lVar12 = lVar12 + -1) {
        }
      }
      uVar7 = (uint)lVar12 ^ 0x3f;
    }
    iVar11 = 0x32 - uVar7;
    if (0x32 < uVar7) {
      iVar11 = 0;
    }
    bVar6 = 0xc;
    if (0x4000 < size) {
      bVar6 = (char)iVar11 + 0xb;
    }
    uVar5 = (ulong)(((uint)(uVar5 >> (bVar6 & 0x3f)) & 3) + iVar11 * 4);
  }
  else {
    uVar5 = 199;
  }
  shard = sec_shard_pick(tsdn,(sec_t *)self);
  psVar8 = shard->bins + uVar5;
  local_48 = (pthread_mutex_t *)((long)&(shard->mtx).field_0 + 0x48);
  iVar11 = pthread_mutex_trylock(local_48);
  if (iVar11 != 0) {
    duckdb_je_malloc_mutex_lock_slow(&shard->mtx);
    (shard->mtx).field_0.field_0.locked.repr = true;
  }
  puVar1 = &(shard->mtx).field_0.field_0.prof_data.n_lock_ops;
  *puVar1 = *puVar1 + 1;
  if ((shard->mtx).field_0.field_0.prof_data.prev_owner != tsdn) {
    (shard->mtx).field_0.field_0.prof_data.prev_owner = tsdn;
    ppwVar2 = &(shard->mtx).field_0.witness.link.qre_prev;
    *ppwVar2 = (witness_t *)((long)&(*ppwVar2)->name + 1);
  }
  if ((shard->enabled == true) &&
     (eVar10.head.qlh_first = (anon_struct_8_1_803fbc3e_for_head)(psVar8->freelist).head.qlh_first,
     eVar10.head.qlh_first != (edata_t *)0x0)) {
    peVar4 = (((edata_t *)eVar10.head.qlh_first)->field_5).ql_link_active.qre_next;
    (psVar8->freelist).head.qlh_first = peVar4;
    if ((anon_struct_8_1_803fbc3e_for_head)peVar4 == eVar10.head.qlh_first) {
      (psVar8->freelist).head.qlh_first = (edata_t *)0x0;
    }
    else {
      (((((edata_t *)eVar10.head.qlh_first)->field_5).ql_link_active.qre_prev)->field_5).
      ql_link_active.qre_next = (peVar4->field_5).ql_link_active.qre_prev;
      peVar4 = (((edata_t *)eVar10.head.qlh_first)->field_5).ql_link_active.qre_prev;
      (((((edata_t *)eVar10.head.qlh_first)->field_5).ql_link_active.qre_next)->field_5).
      ql_link_active.qre_prev = peVar4;
      (((edata_t *)eVar10.head.qlh_first)->field_5).ql_link_active.qre_prev =
           (peVar4->field_5).ql_link_active.qre_next;
      peVar4 = (((edata_t *)eVar10.head.qlh_first)->field_5).ql_link_active.qre_next;
      (((peVar4->field_5).ql_link_active.qre_prev)->field_5).ql_link_active.qre_next = peVar4;
      (((((edata_t *)eVar10.head.qlh_first)->field_5).ql_link_active.qre_prev)->field_5).
      ql_link_active.qre_next = (edata_t *)eVar10.head.qlh_first;
    }
    psVar8->bytes_cur =
         psVar8->bytes_cur -
         ((((edata_t *)eVar10.head.qlh_first)->field_2).e_size_esn & 0xfffffffffffff000);
    shard->bytes_cur =
         shard->bytes_cur -
         ((((edata_t *)eVar10.head.qlh_first)->field_2).e_size_esn & 0xfffffffffffff000);
    goto LAB_01c59a8a;
  }
  if ((psVar8->being_batch_filled != false) ||
     (self[1].dalloc_batch ==
      (_func_void_tsdn_t_ptr_pai_t_ptr_edata_list_active_t_ptr__Bool_ptr *)0x0)) {
    (shard->mtx).field_0.field_0.locked.repr = false;
    pthread_mutex_unlock(local_48);
    peVar4 = (edata_t *)(**(code **)self[1].alloc)(tsdn,self[1].alloc,size,alignment,0,0);
    return peVar4;
  }
  psVar8->being_batch_filled = true;
  (shard->mtx).field_0.field_0.locked.repr = false;
  pthread_mutex_unlock(local_48);
  result.head.qlh_first = (anon_struct_8_1_803fbc3e_for_head)(edata_t *)0x0;
  local_49 = 0;
  uVar5 = (**(code **)(self[1].alloc + 8))
                    (tsdn,self[1].alloc,size,self[1].dalloc_batch + 1,&result,frequent_reuse,
                     &local_49);
  eVar10 = result;
  if (result.head.qlh_first != (edata_t *)0x0) {
    aVar3.qlh_first = *(edata_t **)((long)result.head.qlh_first + 0x28);
    if ((anon_struct_8_1_803fbc3e_for_head)aVar3.qlh_first == result.head.qlh_first) {
      result.head.qlh_first = (anon_struct_8_1_803fbc3e_for_head)(edata_t *)0x0;
    }
    else {
      *(edata_t **)(*(long *)((long)result.head.qlh_first + 0x30) + 0x28) =
           ((aVar3.qlh_first)->field_5).ql_link_active.qre_prev;
      lVar12 = *(long *)((long)result.head.qlh_first + 0x30);
      *(long *)(*(long *)((long)result.head.qlh_first + 0x28) + 0x30) = lVar12;
      *(undefined8 *)((long)result.head.qlh_first + 0x30) = *(undefined8 *)(lVar12 + 0x28);
      *(long *)(*(long *)(*(long *)((long)result.head.qlh_first + 0x28) + 0x30) + 0x28) =
           *(long *)((long)result.head.qlh_first + 0x28);
      ((anon_struct_8_1_803fbc3e_for_head *)(*(long *)((long)result.head.qlh_first + 0x30) + 0x28))
      ->qlh_first = (edata_t *)result.head.qlh_first;
      result.head.qlh_first =
           (anon_struct_8_1_803fbc3e_for_head)(anon_struct_8_1_803fbc3e_for_head)aVar3.qlh_first;
    }
  }
  iVar11 = pthread_mutex_trylock(local_48);
  if (iVar11 != 0) {
    duckdb_je_malloc_mutex_lock_slow(&shard->mtx);
    (shard->mtx).field_0.field_0.locked.repr = true;
  }
  puVar1 = &(shard->mtx).field_0.field_0.prof_data.n_lock_ops;
  *puVar1 = *puVar1 + 1;
  if ((shard->mtx).field_0.field_0.prof_data.prev_owner != tsdn) {
    (shard->mtx).field_0.field_0.prof_data.prev_owner = tsdn;
    ppwVar2 = &(shard->mtx).field_0.witness.link.qre_prev;
    *ppwVar2 = (witness_t *)((long)&(*ppwVar2)->name + 1);
  }
  psVar8->being_batch_filled = false;
  if (uVar5 < 2) goto LAB_01c59a8a;
  lVar12 = (uVar5 - 1) * size;
  peVar9 = &psVar8->freelist;
  peVar4 = (psVar8->freelist).head.qlh_first;
  if (peVar4 == (edata_t *)0x0) {
LAB_01c59a54:
    (peVar9->head).qlh_first = (edata_t *)result.head.qlh_first;
    result.head.qlh_first = (anon_struct_8_1_803fbc3e_for_head)(edata_t *)0x0;
  }
  else if (result.head.qlh_first != (edata_t *)0x0) {
    *(edata_t **)(*(long *)((long)result.head.qlh_first + 0x30) + 0x28) =
         (peVar4->field_5).ql_link_active.qre_prev;
    peVar4 = *(edata_t **)((long)result.head.qlh_first + 0x30);
    (((peVar9->head).qlh_first)->field_5).ql_link_active.qre_prev = peVar4;
    *(edata_t **)((long)result.head.qlh_first + 0x30) = (peVar4->field_5).ql_link_active.qre_next;
    peVar4 = (peVar9->head).qlh_first;
    (((peVar4->field_5).ql_link_active.qre_prev)->field_5).ql_link_active.qre_next = peVar4;
    peVar9 = (edata_list_active_t *)(*(long *)((long)result.head.qlh_first + 0x30) + 0x28);
    goto LAB_01c59a54;
  }
  psVar8->bytes_cur = psVar8->bytes_cur + lVar12;
  p_Var13 = (_func__Bool_tsdn_t_ptr_pai_t_ptr_edata_t_ptr_size_t_size_t__Bool_ptr *)
            (lVar12 + shard->bytes_cur);
  shard->bytes_cur = (size_t)p_Var13;
  if (self[1].shrink < p_Var13) {
    sec_flush_some_and_unlock(tsdn,(sec_t *)self,shard);
    return (edata_t *)eVar10.head.qlh_first;
  }
LAB_01c59a8a:
  (shard->mtx).field_0.field_0.locked.repr = false;
  pthread_mutex_unlock(local_48);
  return eVar10.head.qlh_first.qlh_first;
}

Assistant:

static edata_t *
sec_alloc(tsdn_t *tsdn, pai_t *self, size_t size, size_t alignment, bool zero,
    bool guarded, bool frequent_reuse, bool *deferred_work_generated) {
	assert((size & PAGE_MASK) == 0);
	assert(!guarded);

	sec_t *sec = (sec_t *)self;

	if (zero || alignment > PAGE || sec->opts.nshards == 0
	    || size > sec->opts.max_alloc) {
		return pai_alloc(tsdn, sec->fallback, size, alignment, zero,
		    /* guarded */ false, frequent_reuse,
		    deferred_work_generated);
	}
	pszind_t pszind = sz_psz2ind(size);
	assert(pszind < sec->npsizes);

	sec_shard_t *shard = sec_shard_pick(tsdn, sec);
	sec_bin_t *bin = &shard->bins[pszind];
	bool do_batch_fill = false;

	malloc_mutex_lock(tsdn, &shard->mtx);
	edata_t *edata = sec_shard_alloc_locked(tsdn, sec, shard, bin);
	if (edata == NULL) {
		if (!bin->being_batch_filled
		    && sec->opts.batch_fill_extra > 0) {
			bin->being_batch_filled = true;
			do_batch_fill = true;
		}
	}
	malloc_mutex_unlock(tsdn, &shard->mtx);
	if (edata == NULL) {
		if (do_batch_fill) {
			edata = sec_batch_fill_and_alloc(tsdn, sec, shard, bin,
			    size, frequent_reuse);
		} else {
			edata = pai_alloc(tsdn, sec->fallback, size, alignment,
			    zero, /* guarded */ false, frequent_reuse,
			    deferred_work_generated);
		}
	}
	return edata;
}